

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<unsigned_short,unsigned_short,unsigned_short,unsigned_short,unsigned_short>
               (ostream *out,char *fmt,unsigned_short *args,unsigned_short *args_1,
               unsigned_short *args_2,unsigned_short *args_3,unsigned_short *args_4)

{
  unsigned_short *in_RCX;
  unsigned_short *in_RSI;
  FormatListRef in_RDI;
  unsigned_short *in_R8;
  unsigned_short *in_R9;
  long in_FS_OFFSET;
  ostream *out_00;
  ostream local_90 [136];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  out_00 = local_90;
  makeFormatList<unsigned_short,unsigned_short,unsigned_short,unsigned_short,unsigned_short>
            (in_RCX,in_R8,in_R9,(unsigned_short *)out_00,in_RSI);
  vformat(out_00,(char *)in_RSI,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}